

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O0

void region_erase_bordered(region *loc)

{
  region rVar1;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 uStack_20;
  wchar_t i;
  region calc;
  region *loc_local;
  
  rVar1 = region_calculate(*loc);
  uStack_20 = rVar1.col;
  if (uStack_20 + -1 < 0) {
    local_28 = L'\0';
  }
  else {
    local_28 = uStack_20 + L'\xffffffff';
  }
  i = rVar1.row;
  if (i + L'\xffffffff' < 0) {
    local_2c = 0;
  }
  else {
    local_2c = i + L'\xffffffff';
  }
  calc.col = rVar1.width;
  calc.row = rVar1.page_rows;
  for (local_24 = 0; local_24 < calc.row + 2; local_24 = local_24 + 1) {
    Term_erase(local_28,local_2c + local_24,calc.col + L'\x02');
  }
  return;
}

Assistant:

void region_erase_bordered(const region *loc)
{
	region calc = region_calculate(*loc);
	int i = 0;

	calc.col = MAX(calc.col - 1, 0);
	calc.row = MAX(calc.row - 1, 0);
	calc.width += 2;
	calc.page_rows += 2;

	for (i = 0; i < calc.page_rows; i++)
		Term_erase(calc.col, calc.row + i, calc.width);
}